

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall
asmjit::v1_14::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  ZoneAllocator ZVar1;
  ZoneHashBase ZVar2;
  uint uVar3;
  ZoneAllocator *pZVar4;
  ZoneAllocator *pZVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ZoneAllocator *pZVar10;
  void *pvVar11;
  ulong uVar12;
  uint extraout_EDX;
  uint uVar13;
  ZoneAllocator *pZVar14;
  undefined8 *extraout_RDX;
  size_t sStack_40;
  
  if (*(long *)this == 0) {
    _releaseDynamic();
  }
  else {
    pZVar4 = *(ZoneAllocator **)((long)p + -8);
    pZVar10 = this + 0x58;
    pZVar14 = pZVar10;
    do {
      pZVar5 = *(ZoneAllocator **)pZVar14;
      if (pZVar5 == pZVar4) break;
      pZVar14 = pZVar5 + 8;
    } while (pZVar5 != (ZoneAllocator *)0x0);
    this = pZVar4;
    if (pZVar5 != (ZoneAllocator *)0x0) {
      lVar6 = *(long *)pZVar4;
      plVar7 = *(long **)(pZVar4 + 8);
      pZVar14 = (ZoneAllocator *)(lVar6 + 8);
      if (lVar6 == 0) {
        pZVar14 = pZVar10;
      }
      *(long **)pZVar14 = plVar7;
      if (plVar7 != (long *)0x0) {
        *plVar7 = lVar6;
      }
      free(pZVar4);
      return;
    }
  }
  _releaseDynamic();
  if (extraout_EDX < 0x81) {
    pZVar14 = this;
    if (*p == 0) goto LAB_0012cccc;
    uVar12 = (ulong)extraout_EDX;
    uVar13 = *(uint *)(ZoneHash_primeArray + uVar12 * 8);
    pZVar4 = *(ZoneAllocator **)this;
    pvVar11 = _allocZeroed((ZoneAllocator *)p,(ulong)uVar13 * 8,&sStack_40);
    if (pvVar11 == (void *)0x0) {
      return;
    }
    pZVar14 = (ZoneAllocator *)(ulong)*(uint *)(this + 0x10);
    *(void **)this = pvVar11;
    *(uint *)(this + 0x10) = uVar13;
    *(int *)(this + 0x14) = (int)(long)((double)uVar13 * 0.9);
    uVar3 = *(uint *)(ZoneHash_primeArray + uVar12 * 8 + 4);
    *(uint *)(this + 0x18) = uVar3;
    ZVar1 = *(ZoneAllocator *)(ZoneHash_primeShift + uVar12);
    this[0x1c] = ZVar1;
    this[0x1d] = SUB41(extraout_EDX,0);
    if (pZVar14 != (ZoneAllocator *)0x0) {
      pZVar10 = (ZoneAllocator *)0x0;
      do {
        puVar9 = *(undefined8 **)(pZVar4 + (long)pZVar10 * 8);
        while (puVar9 != (undefined8 *)0x0) {
          puVar8 = (undefined8 *)*puVar9;
          uVar12 = (ulong)(*(uint *)(puVar9 + 1) -
                          (int)((ulong)*(uint *)(puVar9 + 1) * (ulong)uVar3 >> ((byte)ZVar1 & 0x3f))
                          * uVar13);
          *puVar9 = *(undefined8 *)((long)pvVar11 + uVar12 * 8);
          *(undefined8 **)((long)pvVar11 + uVar12 * 8) = puVar9;
          puVar9 = puVar8;
        }
        pZVar10 = pZVar10 + 1;
      } while (pZVar10 != pZVar14);
    }
    if (pZVar4 == this + 0x20) {
      return;
    }
    if (*p == 0) goto LAB_0012ccd1;
    if (pZVar4 != (ZoneAllocator *)0x0) {
      if (pZVar14 != (ZoneAllocator *)0x0) {
        ZoneHashBase::_rehash();
        return;
      }
      goto LAB_0012ccdb;
    }
  }
  else {
    ZoneHashBase::_rehash();
    pZVar14 = this;
LAB_0012cccc:
    ZoneHashBase::_rehash();
LAB_0012ccd1:
    ZoneHashBase::_rehash();
  }
  ZoneHashBase::_rehash();
LAB_0012ccdb:
  ZoneHashBase::_rehash();
  uVar12 = (ulong)(*(uint *)(extraout_RDX + 1) -
                  (int)((ulong)*(uint *)((ZoneHashBase *)pZVar14 + 0x18) *
                        (ulong)*(uint *)(extraout_RDX + 1) >>
                       ((byte)((ZoneHashBase *)pZVar14)[0x1c] & 0x3f)) *
                  *(int *)((ZoneHashBase *)pZVar14 + 0x10));
  lVar6 = *(long *)pZVar14;
  *extraout_RDX = *(undefined8 *)(lVar6 + uVar12 * 8);
  *(undefined8 **)(lVar6 + uVar12 * 8) = extraout_RDX;
  lVar6 = *(long *)((ZoneHashBase *)pZVar14 + 8);
  *(ulong *)((ZoneHashBase *)pZVar14 + 8) = lVar6 + 1U;
  if ((ulong)*(uint *)((ZoneHashBase *)pZVar14 + 0x14) < lVar6 + 1U) {
    ZVar2 = ((ZoneHashBase *)pZVar14)[0x1d];
    uVar13 = 0x7e;
    if ((byte)ZVar2 < 0x7e) {
      uVar13 = (uint)(byte)ZVar2;
    }
    if ((uint)(byte)ZVar2 < uVar13 + 2) {
      ZoneHashBase::_rehash((ZoneHashBase *)pZVar14,(ZoneAllocator *)p,uVar13 + 2);
    }
  }
  return;
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}